

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openxr_program.cpp
# Opt level: O1

XrEnvironmentBlendMode __thiscall
anon_unknown.dwarf_6340f::OpenXrProgram::GetPreferredBlendMode(OpenXrProgram *this)

{
  XrResult XVar1;
  size_type sVar2;
  XrEnvironmentBlendMode unaff_EBP;
  XrEnvironmentBlendMode *blendMode;
  pointer __x;
  bool bVar3;
  uint32_t count;
  vector<XrEnvironmentBlendMode,_std::allocator<XrEnvironmentBlendMode>_> blendModes;
  allocator_type local_85;
  uint local_84;
  vector<XrEnvironmentBlendMode,_std::allocator<XrEnvironmentBlendMode>_> local_80;
  string local_68;
  string local_48;
  
  XVar1 = xrEnumerateEnvironmentBlendModes
                    (this->m_instance,this->m_systemId,
                     (((this->m_options).
                       super___shared_ptr<const_Options,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->Parsed
                     ).ViewConfigType,0,&local_84,0);
  if (XVar1 < XR_SUCCESS) {
    ThrowXrResult(XVar1,
                  "xrEnumerateEnvironmentBlendModes(m_instance, m_systemId, m_options->Parsed.ViewConfigType, 0, &count, nullptr)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:283"
                 );
  }
  if ((ulong)local_84 == 0) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Check failed","");
    Throw(&local_48,"count > 0",
          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:284"
         );
  }
  std::vector<XrEnvironmentBlendMode,_std::allocator<XrEnvironmentBlendMode>_>::vector
            (&local_80,(ulong)local_84,&local_85);
  XVar1 = xrEnumerateEnvironmentBlendModes
                    (this->m_instance,this->m_systemId,
                     (((this->m_options).
                       super___shared_ptr<const_Options,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->Parsed
                     ).ViewConfigType,local_84,&local_84,
                     local_80.
                     super__Vector_base<XrEnvironmentBlendMode,_std::allocator<XrEnvironmentBlendMode>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  if (XVar1 < XR_SUCCESS) {
    ThrowXrResult(XVar1,
                  "xrEnumerateEnvironmentBlendModes(m_instance, m_systemId, m_options->Parsed.ViewConfigType, count, &count, blendModes.data())"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:288"
                 );
  }
  bVar3 = local_80.
          super__Vector_base<XrEnvironmentBlendMode,_std::allocator<XrEnvironmentBlendMode>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          local_80.
          super__Vector_base<XrEnvironmentBlendMode,_std::allocator<XrEnvironmentBlendMode>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  if (!bVar3) {
    __x = local_80.
          super__Vector_base<XrEnvironmentBlendMode,_std::allocator<XrEnvironmentBlendMode>_>.
          _M_impl.super__Vector_impl_data._M_start;
    do {
      sVar2 = std::
              set<XrEnvironmentBlendMode,_std::less<XrEnvironmentBlendMode>,_std::allocator<XrEnvironmentBlendMode>_>
              ::count(&this->m_acceptableBlendModes,__x);
      if (sVar2 != 0) {
        unaff_EBP = *__x;
        break;
      }
      __x = __x + 1;
      bVar3 = __x == local_80.
                     super__Vector_base<XrEnvironmentBlendMode,_std::allocator<XrEnvironmentBlendMode>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
    } while (!bVar3);
  }
  if (!bVar3) {
    if (local_80.super__Vector_base<XrEnvironmentBlendMode,_std::allocator<XrEnvironmentBlendMode>_>
        ._M_impl.super__Vector_impl_data._M_start != (key_type *)0x0) {
      operator_delete(local_80.
                      super__Vector_base<XrEnvironmentBlendMode,_std::allocator<XrEnvironmentBlendMode>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_80.
                            super__Vector_base<XrEnvironmentBlendMode,_std::allocator<XrEnvironmentBlendMode>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_80.
                            super__Vector_base<XrEnvironmentBlendMode,_std::allocator<XrEnvironmentBlendMode>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return unaff_EBP;
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "No acceptable blend mode returned from the xrEnumerateEnvironmentBlendModes","");
  Throw(&local_68,(char *)0x0,
        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:292"
       );
}

Assistant:

XrEnvironmentBlendMode GetPreferredBlendMode() const override {
        uint32_t count;
        CHECK_XRCMD(xrEnumerateEnvironmentBlendModes(m_instance, m_systemId, m_options->Parsed.ViewConfigType, 0, &count, nullptr));
        CHECK(count > 0);

        std::vector<XrEnvironmentBlendMode> blendModes(count);
        CHECK_XRCMD(xrEnumerateEnvironmentBlendModes(m_instance, m_systemId, m_options->Parsed.ViewConfigType, count, &count,
                                                     blendModes.data()));
        for (const auto& blendMode : blendModes) {
            if (m_acceptableBlendModes.count(blendMode)) return blendMode;
        }
        THROW("No acceptable blend mode returned from the xrEnumerateEnvironmentBlendModes");
    }